

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

void __thiscall
boost::runtime::argument_factory<std::__cxx11::string,false,false>::
argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::__cxx11::string_const,boost::runtime::(anonymous_namespace)::default_value_t,std::__cxx11::string_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
          (argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           *this,named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::runtime::(anonymous_namespace)::default_value_t,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
                 *m)

{
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::runtime::(anonymous_namespace)::default_value_t,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *pnVar1;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::runtime::(anonymous_namespace)::default_value_t,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *in_RSI;
  value_interpreter<std::__cxx11::string,false> *in_RDI;
  string local_68 [48];
  string local_38 [40];
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::runtime::(anonymous_namespace)::default_value_t,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  value_interpreter<std::__cxx11::string,false>::
  value_interpreter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::__cxx11::string_const,boost::runtime::(anonymous_namespace)::default_value_t,std::__cxx11::string_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
            (in_RDI,in_RSI);
  pnVar1 = local_10;
  std::__cxx11::string::string(local_38);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::__cxx11::string_const,boost::runtime::(anonymous_namespace)::default_value_t,std::__cxx11::string_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::keyword<boost::runtime::(anonymous_namespace)::optional_value_t,false>>
            (in_RDI + 8,pnVar1,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(local_68);
  nfp::
  opt_get<std::__cxx11::string,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::__cxx11::string_const,boost::runtime::(anonymous_namespace)::default_value_t,std::__cxx11::string_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>,boost::nfp::keyword<boost::runtime::(anonymous_namespace)::default_value_t,false>>
            (in_RDI + 0x28,local_10,local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

explicit    argument_factory( Modifiers const& m )
    : m_interpreter( m )
    , m_optional_value( nfp::opt_get( m, optional_value, ValueType() ) )
    , m_default_value( nfp::opt_get( m, default_value, ValueType() ) )
    {
    }